

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
spirv_cross::
SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>::
push_back(SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  size_t sVar4;
  pointer pcVar5;
  undefined8 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  
  reserve(this,(this->
               super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).buffer_size + 1);
  pbVar7 = (this->
           super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).ptr;
  sVar4 = (this->
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).buffer_size;
  pbVar3 = pbVar7 + sVar4;
  pbVar7 = pbVar7 + sVar4;
  (pbVar7->_M_dataplus)._M_p = (pointer)&pbVar7->field_2;
  pcVar5 = (t->_M_dataplus)._M_p;
  paVar1 = &t->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar1) {
    uVar6 = *(undefined8 *)((long)&t->field_2 + 8);
    (pbVar7->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&pbVar7->field_2 + 8) = uVar6;
  }
  else {
    (pbVar3->_M_dataplus)._M_p = pcVar5;
    (pbVar3->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  pbVar3->_M_string_length = t->_M_string_length;
  (t->_M_dataplus)._M_p = (pointer)paVar1;
  t->_M_string_length = 0;
  (t->field_2)._M_local_buf[0] = '\0';
  psVar2 = &(this->
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).buffer_size;
  *psVar2 = *psVar2 + 1;
  return;
}

Assistant:

void push_back(T &&t) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::move(t));
		this->buffer_size++;
	}